

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O1

void __thiscall CWire::AssignLayer(CWire *this,int iLayer)

{
  uint uVar1;
  CNet *this_00;
  int iVar2;
  CLayer *pCVar3;
  CGrid *pCVar4;
  
  uVar1 = (this->super_CObject).m_iState;
  if ((uVar1 & 1) == 0) {
    pCVar3 = CDesign::GetLayer(CObject::m_pDesign,iLayer);
    pCVar4 = CLayer::GetGrid(pCVar3,(int)this->m_pPointS->m_iX,(int)this->m_pPointS->m_iY);
    this->m_pPointS = (CPoint *)pCVar4;
    pCVar3 = CDesign::GetLayer(CObject::m_pDesign,iLayer);
    pCVar4 = CLayer::GetGrid(pCVar3,(int)this->m_pPointE->m_iX,(int)this->m_pPointE->m_iY);
    this->m_pPointE = (CPoint *)pCVar4;
    (this->super_CObject).m_Key =
         CONCAT44((int)(this->m_pPointS->super_CObject).m_Key,
                  (int)(pCVar4->super_CBoundary).super_CPoint.super_CObject.m_Key) &
         0xffffff00ffffff00;
    return;
  }
  if ((((uVar1 & 4) == 0) || (pCVar3 = GetLayer(this), pCVar3 == (CLayer *)0x0)) &&
     ((((this->super_CObject).m_iState & 4) != 0 ||
      (pCVar3 = GetLayer(this), pCVar3 != (CLayer *)0x0)))) {
    __assert_fail("(IsLayerAssigned()&&GetLayer())||(!IsLayerAssigned()&&!GetLayer())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x121,"void CWire::AssignLayer(int)");
  }
  if (((this->super_CObject).m_iState & 4) != 0) {
    pCVar3 = GetLayer(this);
    iVar2 = CLayer::Z(pCVar3);
    if (iVar2 == iLayer) {
      return;
    }
  }
  this_00 = (CNet *)(this->super_CObject).m_pParent;
  if (this_00 == (CNet *)0x0) {
    __assert_fail("pNet",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x126,"void CWire::AssignLayer(int)");
  }
  CNet::DelWire(this_00,this,0);
  pCVar3 = CDesign::GetLayer(CObject::m_pDesign,iLayer);
  pCVar4 = CLayer::GetGrid(pCVar3,(int)this->m_pPointS->m_iX,(int)this->m_pPointS->m_iY);
  this->m_pPointS = (CPoint *)pCVar4;
  pCVar3 = CDesign::GetLayer(CObject::m_pDesign,iLayer);
  pCVar4 = CLayer::GetGrid(pCVar3,(int)this->m_pPointE->m_iX,(int)this->m_pPointE->m_iY);
  this->m_pPointE = (CPoint *)pCVar4;
  (this->super_CObject).m_Key =
       CONCAT44((int)(this->m_pPointS->super_CObject).m_Key,
                (int)(pCVar4->super_CBoundary).super_CPoint.super_CObject.m_Key) &
       0xffffff00ffffff00;
  (this->super_CObject).m_iState =
       ((this->super_CObject).m_iState & 0xfffffff3U) + (uint)(iLayer == 0) * 4 + 4;
  CNet::AddWire(this_00,this);
  return;
}

Assistant:

void CWire::AssignLayer(int iLayer)
{
	if(IsRouted())
	{
		assert((IsLayerAssigned()&&GetLayer())||(!IsLayerAssigned()&&!GetLayer()));
		
		if(IsLayerAssigned()&&GetLayer()->Z()==iLayer)	return;
		
		CNet*	pNet	=	GetParent();
		assert(pNet);
		
		pNet->DelWire(this);
		
		m_pPointS	=	GetDesign()->GetLayer(iLayer)->GetGrid(m_pPointS->X(),m_pPointS->Y());
		m_pPointE	=	GetDesign()->GetLayer(iLayer)->GetGrid(m_pPointE->X(),m_pPointE->Y());
		//m_pPointS->SetZ(iLayer);
		//m_pPointE->SetZ(iLayer);
		CreateKey();	
		
		iLayer?	SetState(STATE_WIRE_ASSGNED):SetState(STATE_WIRE_NOTASSGNED);
		
		pNet->AddWire(this);
	}
	else
	{
		m_pPointS	=	GetDesign()->GetLayer(iLayer)->GetGrid(m_pPointS->X(),m_pPointS->Y());
		m_pPointE	=	GetDesign()->GetLayer(iLayer)->GetGrid(m_pPointE->X(),m_pPointE->Y());
		//m_pPointS->SetZ(iLayer);
		//m_pPointE->SetZ(iLayer);
		
		CreateKey();
	}
}